

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

UBool icu_63::Transliterator::initializeRegistry(UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  TransliteratorRegistry *pTVar4;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  char *src;
  Transliterator *pTVar5;
  NameUnicodeTransliterator *this;
  BreakTransliterator *this_00;
  UErrorCode *in_RSI;
  UnicodeString *text;
  BreakTransliterator *local_538;
  NameUnicodeTransliterator *local_528;
  Transliterator *local_518;
  Transliterator *local_508;
  Transliterator *local_4f8;
  Transliterator *local_4e8;
  Transliterator *local_4d8;
  TransliteratorRegistry *local_440;
  ConstChar16Ptr local_438;
  UnicodeString local_430;
  ConstChar16Ptr local_3f0;
  UnicodeString local_3e8;
  ConstChar16Ptr local_3a8;
  UnicodeString local_3a0;
  ConstChar16Ptr local_360;
  UnicodeString local_358;
  ConstChar16Ptr local_318;
  UnicodeString local_310;
  ConstChar16Ptr local_2d0;
  UnicodeString local_2c8;
  undefined1 local_281;
  BreakTransliterator *local_280;
  BreakTransliterator *local_278;
  BreakTransliterator *tempBreakTranslit;
  NameUnicodeTransliterator *local_268;
  NameUnicodeTransliterator *local_260;
  NameUnicodeTransliterator *tempNameUnicodeTranslit;
  Transliterator *local_250;
  Transliterator *local_248;
  UnicodeNameTransliterator *tempUnicodeTranslit;
  Transliterator *local_238;
  Transliterator *local_230;
  TitlecaseTransliterator *tempTitlecaseTranslit;
  Transliterator *local_220;
  Transliterator *local_218;
  UppercaseTransliterator *tempUppercaseTranslit;
  Transliterator *local_208;
  Transliterator *local_200;
  LowercaseTransliterator *tempLowercaseTranslit;
  Transliterator *local_1f0;
  Transliterator *local_1e8;
  NullTransliterator *tempNullTranslit;
  UnicodeString local_1d8;
  ConstChar16Ptr local_198;
  UnicodeString local_190;
  UnicodeString local_150;
  UTransDirection local_110;
  UBool local_109;
  UTransDirection dir;
  UBool visible;
  UChar *resString;
  int32_t len;
  UChar type;
  char *typeStr;
  UResourceBundle *res;
  undefined1 local_e0 [8];
  UnicodeString id;
  int32_t maxRows;
  int32_t row;
  undefined1 local_90 [8];
  UnicodeString T_PART;
  UResourceBundle *colBund;
  UResourceBundle *transIDs;
  UResourceBundle *bundle;
  UErrorCode *status_local;
  
  if (registry == (TransliteratorRegistry *)0x0) {
    pTVar4 = (TransliteratorRegistry *)UMemory::operator_new((UMemory *)0x108,(size_t)in_RSI);
    local_440 = (TransliteratorRegistry *)0x0;
    if (pTVar4 != (TransliteratorRegistry *)0x0) {
      in_RSI = status;
      TransliteratorRegistry::TransliteratorRegistry(pTVar4,status);
      local_440 = pTVar4;
    }
    registry = local_440;
    if ((local_440 == (TransliteratorRegistry *)0x0) ||
       (UVar1 = ::U_FAILURE(*status), UVar1 != '\0')) {
      pTVar4 = registry;
      if (registry != (TransliteratorRegistry *)0x0) {
        TransliteratorRegistry::~TransliteratorRegistry(registry);
        UMemory::operator_delete((UMemory *)pTVar4,in_RSI);
      }
      registry = (TransliteratorRegistry *)0x0;
      status_local._7_1_ = '\0';
    }
    else {
      resB = ures_open_63("icudt63l-translit",(char *)0x0,status);
      resB_00 = ures_getByKey_63(resB,"RuleBasedTransliteratorIDs",(UResourceBundle *)0x0,status);
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&maxRows,L"-t-");
      text = (UnicodeString *)0x1;
      icu_63::UnicodeString::UnicodeString
                ((UnicodeString *)local_90,'\x01',(ConstChar16Ptr *)&maxRows,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&maxRows);
      UVar1 = ::U_SUCCESS(*status);
      if (UVar1 != '\0') {
        id.fUnion._48_4_ = ures_getSize_63(resB_00);
        for (id.fUnion._52_4_ = 0; (int)id.fUnion._52_4_ < (int)id.fUnion._48_4_;
            id.fUnion._52_4_ = id.fUnion._52_4_ + 1) {
          text = (UnicodeString *)(ulong)(uint)id.fUnion._52_4_;
          T_PART.fUnion._48_8_ =
               ures_getByIndex_63(resB_00,id.fUnion._52_4_,(UResourceBundle *)0x0,status);
          UVar1 = ::U_SUCCESS(*status);
          if (UVar1 == '\0') {
LAB_002e3082:
            ures_close_63((UResourceBundle *)T_PART.fUnion._48_8_);
          }
          else {
            src = ures_getKey_63((UResourceBundle *)T_PART.fUnion._48_8_);
            icu_63::UnicodeString::UnicodeString((UnicodeString *)local_e0,src,-1,kInvariant);
            text = (UnicodeString *)local_90;
            iVar3 = icu_63::UnicodeString::indexOf((UnicodeString *)local_e0,text);
            if (iVar3 == -1) {
              typeStr = (char *)ures_getNextResource_63
                                          ((UResourceBundle *)T_PART.fUnion._48_8_,
                                           (UResourceBundle *)0x0,status);
              _len = ures_getKey_63((UResourceBundle *)typeStr);
              text = (UnicodeString *)((long)&resString + 6);
              u_charsToUChars_63(_len,(UChar *)text,1);
              UVar1 = ::U_SUCCESS(*status);
              if (UVar1 != '\0') {
                resString._0_4_ = 0;
                if (resString._6_2_ == 0x61) {
                  _dir = ures_getString_63((UResourceBundle *)typeStr,(int32_t *)&resString,status);
                  pTVar4 = registry;
                  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&tempNullTranslit,_dir);
                  icu_63::UnicodeString::UnicodeString
                            (&local_1d8,'\x01',(ConstChar16Ptr *)&tempNullTranslit,
                             (int32_t)resString);
                  text = (UnicodeString *)local_e0;
                  TransliteratorRegistry::put(pTVar4,text,&local_1d8,'\x01','\x01',status);
                  icu_63::UnicodeString::~UnicodeString(&local_1d8);
                  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&tempNullTranslit);
                }
                else if ((resString._6_2_ == 0x66) || (resString._6_2_ == 0x69)) {
                  _dir = ures_getStringByKey_63
                                   ((UResourceBundle *)typeStr,"resource",(int32_t *)&resString,
                                    status);
                  local_109 = resString._6_2_ == 0x66;
                  ures_getUnicodeStringByKey
                            (&local_150,(UResourceBundle *)typeStr,"direction",status);
                  cVar2 = icu_63::UnicodeString::charAt(&local_150,0);
                  icu_63::UnicodeString::~UnicodeString(&local_150);
                  pTVar4 = registry;
                  local_110 = (uint)(cVar2 != L'F');
                  ConstChar16Ptr::ConstChar16Ptr(&local_198,_dir);
                  icu_63::UnicodeString::UnicodeString
                            (&local_190,'\x01',&local_198,(int32_t)resString);
                  text = (UnicodeString *)local_e0;
                  TransliteratorRegistry::put
                            (pTVar4,text,&local_190,local_110,'\x01',local_109,status);
                  icu_63::UnicodeString::~UnicodeString(&local_190);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_198);
                }
              }
              ures_close_63((UResourceBundle *)typeStr);
              res._4_4_ = 0;
            }
            else {
              ures_close_63((UResourceBundle *)T_PART.fUnion._48_8_);
              res._4_4_ = 4;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_e0);
            if (res._4_4_ == 0) goto LAB_002e3082;
          }
        }
      }
      ures_close_63(resB_00);
      ures_close_63(resB);
      pTVar5 = (Transliterator *)UMemory::operator_new((UMemory *)0x58,(size_t)text);
      tempLowercaseTranslit._7_1_ = 0;
      local_4d8 = (Transliterator *)0x0;
      if (pTVar5 != (Transliterator *)0x0) {
        tempLowercaseTranslit._7_1_ = 1;
        local_1f0 = pTVar5;
        NullTransliterator::NullTransliterator((NullTransliterator *)pTVar5);
        local_4d8 = pTVar5;
      }
      local_1e8 = local_4d8;
      pTVar5 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,(size_t)text);
      tempUppercaseTranslit._7_1_ = 0;
      local_4e8 = (Transliterator *)0x0;
      if (pTVar5 != (Transliterator *)0x0) {
        tempUppercaseTranslit._7_1_ = 1;
        local_208 = pTVar5;
        LowercaseTransliterator::LowercaseTransliterator((LowercaseTransliterator *)pTVar5);
        local_4e8 = pTVar5;
      }
      local_200 = local_4e8;
      pTVar5 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,(size_t)text);
      tempTitlecaseTranslit._7_1_ = 0;
      local_4f8 = (Transliterator *)0x0;
      if (pTVar5 != (Transliterator *)0x0) {
        tempTitlecaseTranslit._7_1_ = 1;
        local_220 = pTVar5;
        UppercaseTransliterator::UppercaseTransliterator((UppercaseTransliterator *)pTVar5);
        local_4f8 = pTVar5;
      }
      local_218 = local_4f8;
      pTVar5 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,(size_t)text);
      tempUnicodeTranslit._7_1_ = 0;
      local_508 = (Transliterator *)0x0;
      if (pTVar5 != (Transliterator *)0x0) {
        tempUnicodeTranslit._7_1_ = 1;
        local_238 = pTVar5;
        TitlecaseTransliterator::TitlecaseTransliterator((TitlecaseTransliterator *)pTVar5);
        local_508 = pTVar5;
      }
      local_230 = local_508;
      pTVar5 = (Transliterator *)UMemory::operator_new((UMemory *)0x58,(size_t)text);
      tempNameUnicodeTranslit._7_1_ = 0;
      local_518 = (Transliterator *)0x0;
      if (pTVar5 != (Transliterator *)0x0) {
        tempNameUnicodeTranslit._7_1_ = 1;
        text = (UnicodeString *)0x0;
        local_250 = pTVar5;
        UnicodeNameTransliterator::UnicodeNameTransliterator
                  ((UnicodeNameTransliterator *)pTVar5,(UnicodeFilter *)0x0);
        local_518 = pTVar5;
      }
      local_248 = local_518;
      this = (NameUnicodeTransliterator *)UMemory::operator_new((UMemory *)0xb0,(size_t)text);
      tempBreakTranslit._7_1_ = 0;
      local_528 = (NameUnicodeTransliterator *)0x0;
      if (this != (NameUnicodeTransliterator *)0x0) {
        tempBreakTranslit._7_1_ = 1;
        text = (UnicodeString *)0x0;
        local_268 = this;
        NameUnicodeTransliterator::NameUnicodeTransliterator(this,(UnicodeFilter *)0x0);
        local_528 = this;
      }
      local_260 = local_528;
      this_00 = (BreakTransliterator *)UMemory::operator_new((UMemory *)0xa8,(size_t)text);
      local_281 = 0;
      local_538 = (BreakTransliterator *)0x0;
      if (this_00 != (BreakTransliterator *)0x0) {
        local_281 = 1;
        text = (UnicodeString *)0x0;
        local_280 = this_00;
        BreakTransliterator::BreakTransliterator(this_00,(UnicodeFilter *)0x0);
        local_538 = this_00;
      }
      local_278 = local_538;
      if ((((local_1e8 == (Transliterator *)0x0) || (local_200 == (Transliterator *)0x0)) ||
          (local_218 == (Transliterator *)0x0)) ||
         (((local_230 == (Transliterator *)0x0 || (local_248 == (Transliterator *)0x0)) ||
          ((local_538 == (BreakTransliterator *)0x0 ||
           (local_260 == (NameUnicodeTransliterator *)0x0)))))) {
        if (local_1e8 != (Transliterator *)0x0) {
          (*(local_1e8->super_UObject)._vptr_UObject[1])();
        }
        if (local_200 != (Transliterator *)0x0) {
          (*(((CaseMapTransliterator *)&local_200->super_UObject)->super_Transliterator).
            super_UObject._vptr_UObject[1])();
        }
        if (local_218 != (Transliterator *)0x0) {
          (*(((CaseMapTransliterator *)&local_218->super_UObject)->super_Transliterator).
            super_UObject._vptr_UObject[1])();
        }
        if (local_230 != (Transliterator *)0x0) {
          (*(((CaseMapTransliterator *)&local_230->super_UObject)->super_Transliterator).
            super_UObject._vptr_UObject[1])();
        }
        if (local_248 != (Transliterator *)0x0) {
          (*(((Transliterator *)&local_248->super_UObject)->super_UObject)._vptr_UObject[1])();
        }
        if (local_260 != (NameUnicodeTransliterator *)0x0) {
          (*(local_260->super_Transliterator).super_UObject._vptr_UObject[1])();
        }
        if (local_278 != (BreakTransliterator *)0x0) {
          (*(local_278->super_Transliterator).super_UObject._vptr_UObject[1])();
        }
        pTVar4 = registry;
        if (registry != (TransliteratorRegistry *)0x0) {
          TransliteratorRegistry::~TransliteratorRegistry(registry);
          UMemory::operator_delete((UMemory *)pTVar4,text);
        }
        registry = (TransliteratorRegistry *)0x0;
        *status = U_MEMORY_ALLOCATION_ERROR;
        status_local._7_1_ = '\0';
      }
      else {
        TransliteratorRegistry::put(registry,local_1e8,'\x01',status);
        TransliteratorRegistry::put(registry,local_200,'\x01',status);
        TransliteratorRegistry::put(registry,local_218,'\x01',status);
        TransliteratorRegistry::put(registry,local_230,'\x01',status);
        TransliteratorRegistry::put(registry,local_248,'\x01',status);
        TransliteratorRegistry::put(registry,&local_260->super_Transliterator,'\x01',status);
        TransliteratorRegistry::put(registry,&local_278->super_Transliterator,'\0',status);
        RemoveTransliterator::registerIDs();
        EscapeTransliterator::registerIDs();
        UnescapeTransliterator::registerIDs();
        NormalizationTransliterator::registerIDs();
        AnyTransliterator::registerIDs();
        ConstChar16Ptr::ConstChar16Ptr(&local_2d0,L"Null");
        icu_63::UnicodeString::UnicodeString(&local_2c8,'\x01',&local_2d0,-1);
        ConstChar16Ptr::ConstChar16Ptr(&local_318,L"Null");
        icu_63::UnicodeString::UnicodeString(&local_310,'\x01',&local_318,-1);
        _registerSpecialInverse(&local_2c8,&local_310,'\0');
        icu_63::UnicodeString::~UnicodeString(&local_310);
        ConstChar16Ptr::~ConstChar16Ptr(&local_318);
        icu_63::UnicodeString::~UnicodeString(&local_2c8);
        ConstChar16Ptr::~ConstChar16Ptr(&local_2d0);
        ConstChar16Ptr::ConstChar16Ptr(&local_360,L"Upper");
        icu_63::UnicodeString::UnicodeString(&local_358,'\x01',&local_360,-1);
        ConstChar16Ptr::ConstChar16Ptr(&local_3a8,L"Lower");
        icu_63::UnicodeString::UnicodeString(&local_3a0,'\x01',&local_3a8,-1);
        _registerSpecialInverse(&local_358,&local_3a0,'\x01');
        icu_63::UnicodeString::~UnicodeString(&local_3a0);
        ConstChar16Ptr::~ConstChar16Ptr(&local_3a8);
        icu_63::UnicodeString::~UnicodeString(&local_358);
        ConstChar16Ptr::~ConstChar16Ptr(&local_360);
        ConstChar16Ptr::ConstChar16Ptr(&local_3f0,L"Title");
        icu_63::UnicodeString::UnicodeString(&local_3e8,'\x01',&local_3f0,-1);
        ConstChar16Ptr::ConstChar16Ptr(&local_438,L"Lower");
        icu_63::UnicodeString::UnicodeString(&local_430,'\x01',&local_438,-1);
        _registerSpecialInverse(&local_3e8,&local_430,'\0');
        icu_63::UnicodeString::~UnicodeString(&local_430);
        ConstChar16Ptr::~ConstChar16Ptr(&local_438);
        icu_63::UnicodeString::~UnicodeString(&local_3e8);
        ConstChar16Ptr::~ConstChar16Ptr(&local_3f0);
        ucln_i18n_registerCleanup_63(UCLN_I18N_TRANSLITERATOR,utrans_transliterator_cleanup_63);
        status_local._7_1_ = '\x01';
      }
      res._4_4_ = 1;
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_90);
    }
  }
  else {
    status_local._7_1_ = '\x01';
  }
  return status_local._7_1_;
}

Assistant:

UBool Transliterator::initializeRegistry(UErrorCode &status) {
    if (registry != 0) {
        return TRUE;
    }

    registry = new TransliteratorRegistry(status);
    if (registry == 0 || U_FAILURE(status)) {
        delete registry;
        registry = 0;
        return FALSE; // can't create registry, no recovery
    }

    /* The following code parses the index table located in
     * icu/data/translit/root.txt.  The index is an n x 4 table
     * that follows this format:
     *  <id>{
     *      file{
     *          resource{"<resource>"}
     *          direction{"<direction>"}
     *      }
     *  }
     *  <id>{
     *      internal{
     *          resource{"<resource>"}
     *          direction{"<direction"}
     *       }
     *  }
     *  <id>{
     *      alias{"<getInstanceArg"}
     *  }
     * <id> is the ID of the system transliterator being defined.  These
     * are public IDs enumerated by Transliterator.getAvailableIDs(),
     * unless the second field is "internal".
     * 
     * <resource> is a ResourceReader resource name.  Currently these refer
     * to file names under com/ibm/text/resources.  This string is passed
     * directly to ResourceReader, together with <encoding>.
     * 
     * <direction> is either "FORWARD" or "REVERSE".
     * 
     * <getInstanceArg> is a string to be passed directly to
     * Transliterator.getInstance().  The returned Transliterator object
     * then has its ID changed to <id> and is returned.
     *
     * The extra blank field on "alias" lines is to make the array square.
     */
    //static const char translit_index[] = "translit_index";

    UResourceBundle *bundle, *transIDs, *colBund;
    bundle = ures_open(U_ICUDATA_TRANSLIT, NULL/*open default locale*/, &status);
    transIDs = ures_getByKey(bundle, RB_RULE_BASED_IDS, 0, &status);
    const UnicodeString T_PART = UNICODE_STRING_SIMPLE("-t-");

    int32_t row, maxRows;
    if (U_SUCCESS(status)) {
        maxRows = ures_getSize(transIDs);
        for (row = 0; row < maxRows; row++) {
            colBund = ures_getByIndex(transIDs, row, 0, &status);
            if (U_SUCCESS(status)) {
                UnicodeString id(ures_getKey(colBund), -1, US_INV);
                if(id.indexOf(T_PART) != -1) {
                    ures_close(colBund);
                    continue;
                }
                UResourceBundle* res = ures_getNextResource(colBund, NULL, &status);
                const char* typeStr = ures_getKey(res);
                UChar type;
                u_charsToUChars(typeStr, &type, 1);

                if (U_SUCCESS(status)) {
                    int32_t len = 0;
                    const UChar *resString;
                    switch (type) {
                    case 0x66: // 'f'
                    case 0x69: // 'i'
                        // 'file' or 'internal';
                        // row[2]=resource, row[3]=direction
                        {
                            
                            resString = ures_getStringByKey(res, "resource", &len, &status);
                            UBool visible = (type == 0x0066 /*f*/);
                            UTransDirection dir = 
                                (ures_getUnicodeStringByKey(res, "direction", &status).charAt(0) ==
                                 0x0046 /*F*/) ?
                                UTRANS_FORWARD : UTRANS_REVERSE;
                            registry->put(id, UnicodeString(TRUE, resString, len), dir, TRUE, visible, status);
                        }
                        break;
                    case 0x61: // 'a'
                        // 'alias'; row[2]=createInstance argument
                        resString = ures_getString(res, &len, &status);
                        registry->put(id, UnicodeString(TRUE, resString, len), TRUE, TRUE, status);
                        break;
                    }
                }
                ures_close(res);
            }
            ures_close(colBund);
        }
    }

    ures_close(transIDs);
    ures_close(bundle);

    // Manually add prototypes that the system knows about to the
    // cache.  This is how new non-rule-based transliterators are
    // added to the system.
    
    // This is to allow for null pointer check
    NullTransliterator* tempNullTranslit = new NullTransliterator();
    LowercaseTransliterator* tempLowercaseTranslit = new LowercaseTransliterator();
    UppercaseTransliterator* tempUppercaseTranslit = new UppercaseTransliterator();
    TitlecaseTransliterator* tempTitlecaseTranslit = new TitlecaseTransliterator();
    UnicodeNameTransliterator* tempUnicodeTranslit = new UnicodeNameTransliterator();
    NameUnicodeTransliterator* tempNameUnicodeTranslit = new NameUnicodeTransliterator();
#if !UCONFIG_NO_BREAK_ITERATION
     // TODO: could or should these transliterators be referenced polymorphically once constructed?
     BreakTransliterator* tempBreakTranslit         = new BreakTransliterator();
#endif
    // Check for null pointers
    if (tempNullTranslit == NULL || tempLowercaseTranslit == NULL || tempUppercaseTranslit == NULL ||
        tempTitlecaseTranslit == NULL || tempUnicodeTranslit == NULL || 
#if !UCONFIG_NO_BREAK_ITERATION
        tempBreakTranslit == NULL ||
#endif
        tempNameUnicodeTranslit == NULL )
    {
        delete tempNullTranslit;
        delete tempLowercaseTranslit;
        delete tempUppercaseTranslit;
        delete tempTitlecaseTranslit;
        delete tempUnicodeTranslit;
        delete tempNameUnicodeTranslit;
#if !UCONFIG_NO_BREAK_ITERATION
        delete tempBreakTranslit;
#endif
        // Since there was an error, remove registry
        delete registry;
        registry = NULL;

        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    registry->put(tempNullTranslit, TRUE, status);
    registry->put(tempLowercaseTranslit, TRUE, status);
    registry->put(tempUppercaseTranslit, TRUE, status);
    registry->put(tempTitlecaseTranslit, TRUE, status);
    registry->put(tempUnicodeTranslit, TRUE, status);
    registry->put(tempNameUnicodeTranslit, TRUE, status);
#if !UCONFIG_NO_BREAK_ITERATION
    registry->put(tempBreakTranslit, FALSE, status);   // FALSE means invisible.
#endif

    RemoveTransliterator::registerIDs(); // Must be within mutex
    EscapeTransliterator::registerIDs();
    UnescapeTransliterator::registerIDs();
    NormalizationTransliterator::registerIDs();
    AnyTransliterator::registerIDs();

    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Null"),
                            UNICODE_STRING_SIMPLE("Null"), FALSE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Upper"),
                            UNICODE_STRING_SIMPLE("Lower"), TRUE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Title"),
                            UNICODE_STRING_SIMPLE("Lower"), FALSE);

    ucln_i18n_registerCleanup(UCLN_I18N_TRANSLITERATOR, utrans_transliterator_cleanup);

    return TRUE;
}